

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeUnsignedInteger
          (ParserImpl *this,uint64_t *value,uint64_t max_value)

{
  bool bVar1;
  AlphaNum *in_R8;
  string_view message;
  string_view message_00;
  string local_c0;
  undefined1 local_a0 [48];
  AlphaNum local_70;
  undefined8 local_40;
  char *local_38;
  
  if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
    bVar1 = io::Tokenizer::ParseInteger(&(this->tokenizer_).current_.text,max_value,value);
    if (bVar1) {
      io::Tokenizer::Next(&this->tokenizer_);
      return true;
    }
    local_40 = 0x16;
    local_38 = "Integer out of range (";
    local_70.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_70.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
    local_a0._0_8_ = (char *)0x1;
    local_a0._8_8_ = ")";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_c0,(lts_20250127 *)&local_40,&local_70,(AlphaNum *)local_a0,in_R8);
    message_00._M_str = local_c0._M_dataplus._M_p;
    message_00._M_len = local_c0._M_string_length;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message_00)
    ;
    local_a0._16_8_ = local_c0.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
      return false;
    }
  }
  else {
    local_40 = 0x17;
    local_38 = "Expected integer, got: ";
    local_70.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_70.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_a0,(lts_20250127 *)&local_40,&local_70,
               (AlphaNum *)local_70.piece_._M_len);
    message._M_str = (char *)local_a0._0_8_;
    message._M_len = local_a0._8_8_;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message);
    local_c0._M_dataplus._M_p = (pointer)local_a0._0_8_;
    if ((undefined1 *)local_a0._0_8_ == local_a0 + 0x10) {
      return false;
    }
  }
  operator_delete(local_c0._M_dataplus._M_p,local_a0._16_8_ + 1);
  return false;
}

Assistant:

bool ConsumeUnsignedInteger(uint64_t* value, uint64_t max_value) {
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      ReportError(
          absl::StrCat("Expected integer, got: ", tokenizer_.current().text));
      return false;
    }

    if (!io::Tokenizer::ParseInteger(tokenizer_.current().text, max_value,
                                     value)) {
      ReportError(absl::StrCat("Integer out of range (",
                               tokenizer_.current().text, ")"));
      return false;
    }

    tokenizer_.Next();
    return true;
  }